

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O1

void QWindowContainer::parentWasRaised(QWidget *parent)

{
  long lVar1;
  
  lVar1 = QMetaObject::cast((QObject *)&staticMetaObject);
  if (lVar1 == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = *(long *)(lVar1 + 8);
  }
  if (lVar1 != 0) {
    if (((*(long *)(lVar1 + 600) == 0) || (*(int *)(*(long *)(lVar1 + 600) + 4) == 0)) ||
       (*(long *)(lVar1 + 0x260) == 0)) {
      return;
    }
    lVar1 = QWindow::parent(*(undefined8 *)(lVar1 + 0x260),0);
    if (lVar1 != 0) {
      QWindow::raise();
    }
  }
  qwindowcontainer_traverse(parent,parentWasRaised);
  return;
}

Assistant:

void QWindowContainer::parentWasRaised(QWidget *parent)
{
    if (QWindowContainerPrivate *d = QWindowContainerPrivate::get(parent)) {
        if (!d->window)
            return;
        else if (d->window->parent())
            d->window->raise();
    }
    qwindowcontainer_traverse(parent, parentWasRaised);
}